

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O3

char * flow::cstr(UnaryOperator op)

{
  return &DAT_00182184 + *(int *)(&DAT_00182184 + (long)(int)op * 4);
}

Assistant:

const char* cstr(UnaryOperator op)  // {{{
{
  switch (op) {
  case UnaryOperator::INeg: return "ineg";
  case UnaryOperator::INot: return "inot";
  case UnaryOperator::BNot: return "bnot";
  case UnaryOperator::SLen: return "slen";
  case UnaryOperator::SIsEmpty: return "sisempty";
  }
}